

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O1

void show_topten(char *player,wchar_t top,wchar_t around,nh_bool own)

{
  ulong uVar1;
  uint *__s;
  nh_menuitem_conflict *pnVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  nh_menuitem_conflict *items;
  size_t sVar8;
  char *pcVar9;
  undefined7 in_register_00000009;
  long lVar10;
  ulong uVar11;
  nh_menuitem *_item_;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  uint *puVar16;
  uint uVar17;
  wchar_t listlen;
  char hpbuf [16];
  char fmt [32];
  char buf [256];
  char line [256];
  char txt [256];
  int local_3b0;
  nh_menuitem_role local_3ac;
  nh_menuitem_conflict *local_3a8;
  ulong local_3a0;
  char local_398 [24];
  ulong local_380;
  long local_378;
  long local_370;
  char local_368 [16];
  char local_358 [32];
  char local_338 [256];
  char local_238 [225];
  char acStack_157 [31];
  char local_138 [264];
  
  local_3b0 = 0;
  lVar7 = nh_get_topten(&local_3b0,local_338,player,top,around,
                        CONCAT71(in_register_00000009,own) & 0xffffffff);
  if (local_3b0 == 0) {
    curses_msgwin("There are no scores to show.");
  }
  else {
    wclear(_stdscr);
    wrefresh(_stdscr);
    iVar5 = local_3b0;
    uVar13 = (long)local_3b0 * 2 + 4;
    items = (nh_menuitem_conflict *)malloc(uVar13 * 0x10c);
    if (local_338[0] == '\0') {
      uVar17 = 0;
    }
    else {
      if (iVar5 < -1) {
        uVar17 = (int)uVar13 * 2;
        uVar13 = (ulong)uVar17;
        items = (nh_menuitem_conflict *)realloc(items,(long)(int)uVar17 * 0x10c);
      }
      items->id = L'\0';
      items->role = MI_TEXT;
      items->accel = '\0';
      items->group_accel = '\0';
      items->selected = '\0';
      strcpy(items->caption,local_338);
      if ((int)uVar13 < 2) {
        uVar17 = (int)uVar13 * 2;
        uVar13 = (ulong)uVar17;
        items = (nh_menuitem_conflict *)realloc(items,(long)(int)uVar17 * 0x10c);
      }
      items[1].accel = '\0';
      items[1].group_accel = '\0';
      items[1].selected = '\0';
      items[1].caption[0] = '\0';
      items[1].id = L'\0';
      items[1].role = MI_TEXT;
      uVar17 = 2;
    }
    builtin_strncpy(local_338," No     Points   Name",0x16);
    sVar8 = strlen(local_338);
    uVar1 = (long)_COLS - 0xe;
    if (sVar8 < uVar1) {
      memset(local_338 + sVar8,0x20,((long)_COLS - sVar8) - 0xe);
      sVar8 = uVar1;
    }
    builtin_strncpy(local_338 + sVar8," Hp [max] ",0xb);
    if ((int)uVar13 <= (int)uVar17) {
      uVar4 = (int)uVar13 * 2;
      uVar13 = (ulong)uVar4;
      items = (nh_menuitem_conflict *)realloc(items,(long)(int)uVar4 * 0x10c);
    }
    pnVar2 = items + uVar17;
    pnVar2->id = L'\0';
    pnVar2->role = MI_HEADING;
    pnVar2->accel = '\0';
    pnVar2->group_accel = '\0';
    pnVar2->selected = '\0';
    strcpy(pnVar2->caption,local_338);
    uVar17 = uVar17 | 1;
    if (0 < local_3b0) {
      lVar10 = 0;
      local_378 = lVar7;
      do {
        lVar7 = local_378;
        iVar5 = _COLS;
        lVar15 = lVar10 * 0x298;
        cVar3 = *(char *)(local_378 + 0x294 + lVar15);
        lVar12 = (long)_COLS;
        uVar4 = *(uint *)(local_378 + 0xc + lVar15);
        local_3a8 = items;
        local_3a0 = uVar13;
        local_370 = lVar10;
        if ((int)uVar4 < 1) {
          local_398[0] = '-';
          local_398[1] = '\0';
        }
        else {
          sprintf(local_398,"%d",(ulong)uVar4,0);
        }
        puVar16 = (uint *)(lVar15 + lVar7);
        local_3ac = (uint)(cVar3 != '\0') * 2;
        sprintf(local_368,"[%d]",(ulong)puVar16[4]);
        uVar13 = lVar12 - 0x20;
        __s = puVar16 + 0x65;
        sVar8 = strlen((char *)__s);
        if (uVar13 < sVar8) {
          strncpy(local_138,(char *)__s,0x100);
          pcVar14 = acStack_157 + lVar12;
          uVar1 = uVar13;
          do {
            uVar11 = uVar1;
            pcVar9 = pcVar14;
            pcVar14 = pcVar9 + -1;
            if ((long)uVar11 < 1) break;
            uVar1 = uVar11 - 1;
          } while (pcVar9[-1] != ' ');
          local_380 = uVar13;
          if (5 < (long)uVar11) {
            iVar6 = strncmp(pcVar9 + -6," [max",5);
            if (iVar6 == 0) {
              pcVar14 = pcVar9 + -6;
            }
          }
          *pcVar14 = '\0';
          sprintf(local_358,"%%4d %%10d  %%-%ds",(ulong)(iVar5 - 0x15));
          sprintf(local_238,local_358,(ulong)*puVar16,(ulong)puVar16[1],local_138);
          items = local_3a8;
          uVar13 = local_3a0;
          if ((int)local_3a0 <= (int)uVar17) {
            uVar4 = (int)local_3a0 * 2;
            items = (nh_menuitem_conflict *)realloc(local_3a8,(long)(int)uVar4 * 0x10c);
            uVar13 = (ulong)uVar4;
          }
          pnVar2 = items + (int)uVar17;
          pnVar2->id = L'\0';
          pnVar2->role = local_3ac;
          pnVar2->accel = '\0';
          pnVar2->group_accel = '\0';
          pnVar2->selected = '\0';
          strcpy(pnVar2->caption,local_238);
          uVar17 = uVar17 + 1;
          sprintf(local_358,"%%%ds%%-%ds %%3s %%5s ",0x11,local_380);
          sprintf(local_238,local_358,"",pcVar14 + 1,local_398,local_368);
          if ((int)uVar13 <= (int)uVar17) {
LAB_00117c30:
            uVar4 = (int)uVar13 * 2;
            items = (nh_menuitem_conflict *)realloc(items,(long)(int)uVar4 * 0x10c);
            uVar13 = (ulong)uVar4;
          }
        }
        else {
          sprintf(local_358,"%%4d %%10d  %%-%ds %%3s %%5s ",uVar13 & 0xffffffff);
          sprintf(local_238,local_358,(ulong)*puVar16,(ulong)puVar16[1],__s,local_398,local_368);
          items = local_3a8;
          uVar13 = local_3a0;
          if ((int)local_3a0 <= (int)uVar17) goto LAB_00117c30;
        }
        pnVar2 = items + (int)uVar17;
        pnVar2->id = L'\0';
        pnVar2->role = local_3ac;
        pnVar2->accel = '\0';
        pnVar2->group_accel = '\0';
        pnVar2->selected = '\0';
        strcpy(pnVar2->caption,local_238);
        uVar17 = uVar17 + 1;
        lVar10 = local_370 + 1;
      } while (lVar10 < local_3b0);
    }
    if ((int)uVar13 <= (int)uVar17) {
      items = (nh_menuitem_conflict *)realloc(items,(long)((int)uVar13 * 2) * 0x10c);
    }
    items[(int)uVar17].accel = '\0';
    items[(int)uVar17].group_accel = '\0';
    items[(int)uVar17].selected = '\0';
    items[(int)uVar17].caption[0] = '\0';
    items[(int)uVar17].id = L'\0';
    items[(int)uVar17].role = MI_TEXT;
    curses_display_menu(items,uVar17 + L'\x01',"Top scores:",L'\0',(wchar_t *)0x0);
    free(items);
  }
  return;
}

Assistant:

void show_topten(char *player, int top, int around, nh_bool own)
{
    struct nh_topten_entry *scores;
    char buf[BUFSZ];
    int i, listlen = 0;
    struct nh_menuitem *items;
    int icount, size;
    
    scores = nh_get_topten(&listlen, buf, player, top, around, own);
    
    if (listlen == 0) {
	curses_msgwin("There are no scores to show.");
	return;
    }
    
    /* show the score list on a blank screen */
    clear();
    refresh();

    icount = 0;
    size = 4 + listlen * 2; /* maximum length, only required if every item wraps */
    items = malloc(size * sizeof(struct nh_menuitem));
    
    /* buf has the topten status if there is one, eg:
     *  "you did not beat your previous score" */
    if (buf[0]) { 
	add_menu_txt(items, size, icount, buf, MI_TEXT);
	add_menu_txt(items, size, icount, "", MI_TEXT);
    }
    
    makeheader(buf);
    add_menu_txt(items, size, icount, buf, MI_HEADING);
    
    for (i = 0; i < listlen; i++)
	topten_add_score(&scores[i], &items, &size, &icount, COLS - 4);
    add_menu_txt(items, size, icount, "", MI_TEXT);
    
    curses_display_menu(items, icount, "Top scores:", PICK_NONE, NULL);
    free(items);
}